

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O1

boolean load_special(level *lev,char *name)

{
  byte bVar1;
  uint uVar2;
  opvar *ov;
  bool bVar3;
  bool bVar4;
  boolean bVar5;
  int iVar6;
  dlb *dp;
  byte *buf;
  void *buf_00;
  long lVar7;
  long lVar8;
  sp_lev lvl;
  version_info vers_info;
  int local_6c;
  sp_lev local_68;
  void *local_58;
  long local_50;
  level *local_48;
  version_info local_3c;
  
  dp = dlb_fopen(name,"r");
  if (dp != (dlb *)0x0) {
    iVar6 = dlb_fread(&local_3c,0xc,1,dp);
    if (iVar6 == 1) {
      bVar5 = check_version(&local_3c,name,'\x01');
      if (bVar5 == '\0') {
        bVar5 = '\0';
      }
      else {
        local_48 = lev;
        iVar6 = dlb_fread(&local_68.n_opcodes,1,8,dp);
        lVar7 = local_68.n_opcodes;
        if (iVar6 == 8) {
          local_68.opcodes = (_opcode *)malloc(local_68.n_opcodes << 4);
          if (0 < lVar7) {
            lVar8 = 0;
            lVar7 = 0;
            do {
              iVar6 = dlb_fread((void *)((long)&(local_68.opcodes)->opcode + lVar8),1,4,dp);
              if (iVar6 != 4) goto LAB_0024ae34;
              uVar2 = *(uint *)((long)&(local_68.opcodes)->opcode + lVar8);
              if (0x4b < uVar2) {
                panic("sp_level_loader: impossible opcode %i.",(ulong)uVar2);
              }
              if (uVar2 == 0x28) {
                buf = (byte *)malloc(0x10);
                *buf = 0;
                buf[8] = 0;
                buf[9] = 0;
                buf[10] = 0;
                buf[0xb] = 0;
                buf[0xc] = 0;
                buf[0xd] = 0;
                buf[0xe] = 0;
                buf[0xf] = 0;
                iVar6 = dlb_fread(buf,1,1,dp);
                bVar4 = true;
                if (iVar6 == 1) {
                  bVar1 = *buf;
                  if (9 < bVar1) {
                    panic("sp_level_loader: Unknown opcode %i",0x28);
                  }
                  if ((0x1f2U >> (bVar1 & 0x1f) & 1) == 0) {
                    if ((0x20cU >> (bVar1 & 0x1f) & 1) == 0) goto LAB_0024ad72;
                    iVar6 = dlb_fread(&local_6c,1,4,dp);
                    bVar4 = true;
                    if (iVar6 == 4) {
                      local_50 = (long)local_6c;
                      buf_00 = malloc(local_50 + 1);
                      if ((local_50 != 0) &&
                         (local_58 = buf_00, iVar6 = dlb_fread(buf_00,1,(int)local_50,dp),
                         buf_00 = local_58, iVar6 != local_6c)) goto LAB_0024ad57;
                      *(undefined1 *)((long)buf_00 + (long)local_6c) = 0;
                      *(void **)(buf + 8) = buf_00;
                      bVar4 = false;
                      bVar3 = true;
                    }
                    else {
LAB_0024ad57:
                      bVar3 = false;
                    }
                    if (!bVar3) goto LAB_0024ad75;
                  }
                  else {
                    iVar6 = dlb_fread(buf + 8,1,8,dp);
                    if (iVar6 != 8) goto LAB_0024ad75;
                  }
LAB_0024ad72:
                  bVar4 = false;
                }
LAB_0024ad75:
                if (bVar4) {
                  if (bVar4) goto LAB_0024ae34;
                  break;
                }
              }
              else {
                buf = (byte *)0x0;
              }
              *(byte **)((long)&(local_68.opcodes)->opdat + lVar8) = buf;
              lVar7 = lVar7 + 1;
              lVar8 = lVar8 + 0x10;
            } while (lVar7 < local_68.n_opcodes);
          }
          sp_level_coder(local_48,&local_68);
          bVar5 = '\x01';
        }
        else {
LAB_0024ae34:
          load_special_cold_2();
          bVar5 = '\0';
        }
        if (0 < local_68.n_opcodes) {
          lVar7 = 8;
          lVar8 = 0;
          do {
            ov = *(opvar **)((long)&(local_68.opcodes)->opcode + lVar7);
            if (0x4b < *(uint *)((long)local_68.opcodes + lVar7 + -8)) {
              panic("sp_level_free: unknown opcode %i");
            }
            if (ov != (opvar *)0x0) {
              opvar_free_x(ov);
            }
            lVar8 = lVar8 + 1;
            lVar7 = lVar7 + 0x10;
          } while (lVar8 < local_68.n_opcodes);
        }
        free(local_68.opcodes);
      }
      dlb_fclose(dp);
      return bVar5;
    }
    load_special_cold_1();
  }
  return '\0';
}

Assistant:

boolean load_special(struct level *lev, const char *name)
{
	dlb *fd;
	sp_lev lvl;
	boolean result = FALSE;
	struct version_info vers_info;

	fd = dlb_fopen(name, RDBMODE);
	if (!fd) return FALSE;

	Fread(&vers_info, sizeof vers_info, 1, fd);
	if (!check_version(&vers_info, name, TRUE))
	    goto give_up;

	result = sp_level_loader(lev, fd, &lvl);
	if (result) result = sp_level_coder(lev, &lvl);
	sp_level_free(&lvl);
give_up:
	dlb_fclose(fd);
	return result;

err_out:
	fprintf(stderr, "read error in load_special\n");
	return FALSE;
}